

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O3

Gia_MmFixed_t * Gia_MmFixedStart(int nEntrySize,int nEntriesMax)

{
  Gia_MmFixed_t *pGVar1;
  char **ppcVar2;
  uint uVar3;
  
  pGVar1 = (Gia_MmFixed_t *)calloc(1,0x38);
  pGVar1->nEntrySize = nEntrySize;
  uVar3 = 8;
  if (0x3f < nEntriesMax) {
    uVar3 = (uint)nEntriesMax >> 3;
  }
  pGVar1->nChunkSize = uVar3;
  pGVar1->nChunksAlloc = 0x40;
  ppcVar2 = (char **)malloc(0x200);
  pGVar1->pChunks = ppcVar2;
  return pGVar1;
}

Assistant:

Gia_MmFixed_t * Gia_MmFixedStart( int nEntrySize, int nEntriesMax )
{
    Gia_MmFixed_t * p;

    p = ABC_ALLOC( Gia_MmFixed_t, 1 );
    memset( p, 0, sizeof(Gia_MmFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    p->nChunkSize = nEntriesMax / 8;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}